

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseAssembler::setOffset(BaseAssembler *this,size_t offset)

{
  BaseEmitter *pBVar1;
  BaseEmitter *in_RSI;
  char *in_RDI;
  size_t size;
  BaseEmitter *local_68;
  undefined8 in_stack_ffffffffffffffa8;
  Error err;
  BaseEmitter *in_stack_ffffffffffffffb0;
  BaseEmitter *this_00;
  Error local_2c;
  
  err = (Error)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (*(long *)(in_RDI + 0x30) == 0) {
    DebugUtils::errored(5);
    local_2c = BaseEmitter::reportError(in_stack_ffffffffffffffb0,err,in_RDI);
  }
  else {
    this_00 = *(BaseEmitter **)(*(long *)(in_RDI + 0x90) + 0x50);
    pBVar1 = (BaseEmitter *)(*(long *)(in_RDI + 0xa8) - *(long *)(in_RDI + 0x98));
    local_68 = this_00;
    if (this_00 < pBVar1) {
      local_68 = pBVar1;
    }
    if (local_68 < in_RSI) {
      DebugUtils::errored(2);
      local_2c = BaseEmitter::reportError(this_00,(Error)((ulong)pBVar1 >> 0x20),in_RDI);
    }
    else {
      *(long *)(in_RDI + 0xa8) = (long)&in_RSI->_vptr_BaseEmitter + *(long *)(in_RDI + 0x98);
      local_2c = 0;
    }
  }
  return local_2c;
}

Assistant:

Error BaseAssembler::setOffset(size_t offset) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  size_t size = Support::max<size_t>(_section->bufferSize(), this->offset());
  if (ASMJIT_UNLIKELY(offset > size))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  _bufferPtr = _bufferData + offset;
  return kErrorOk;
}